

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall
flatbuffers::Parser::Parse(Parser *this,char *source,char **include_paths,char *source_filename)

{
  int iVar1;
  byte local_1a;
  
  iVar1 = this->parse_depth_counter_;
  if ((this->opts).use_flexbuffers == true) {
    local_1a = ParseFlexBuffer(this,source,source_filename,&this->flex_builder_);
  }
  else {
    ParseRoot((Parser *)&stack0xffffffffffffffe6,(char *)this,(char **)source,(char *)include_paths)
    ;
    local_1a = local_1a ^ 1;
  }
  if (iVar1 == this->parse_depth_counter_) {
    return (bool)local_1a;
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0xd92,"bool flatbuffers::Parser::Parse(const char *, const char **, const char *)")
  ;
}

Assistant:

bool Parser::Parse(const char *source, const char **include_paths,
                   const char *source_filename) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  bool r;

  if (opts.use_flexbuffers) {
    r = ParseFlexBuffer(source, source_filename, &flex_builder_);
  } else {
    r = !ParseRoot(source, include_paths, source_filename).Check();
  }
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return r;
}